

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

int32_t duckdb::TimeToStringCast::FormatMicros(int32_t microseconds,char *micro_buffer)

{
  char *pcVar1;
  long lVar2;
  
  for (pcVar1 = NumericHelper::FormatUnsigned<int>(microseconds,micro_buffer + 6);
      micro_buffer < pcVar1; pcVar1 = pcVar1 + -1) {
    pcVar1[-1] = '0';
  }
  pcVar1 = micro_buffer + 5;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 5) {
      return 5;
    }
    if (*pcVar1 != '0') break;
    lVar2 = lVar2 + 1;
    pcVar1 = pcVar1 + -1;
  }
  return (int32_t)lVar2;
}

Assistant:

static int32_t FormatMicros(int32_t microseconds, char micro_buffer[]) {
		char *endptr = micro_buffer + 6;
		endptr = NumericHelper::FormatUnsigned<int32_t>(microseconds, endptr);
		while (endptr > micro_buffer) {
			*--endptr = '0';
		}
		idx_t trailing_zeros = 0;
		for (idx_t i = 5; i > 0; i--) {
			if (micro_buffer[i] != '0') {
				break;
			}
			trailing_zeros++;
		}
		return UnsafeNumericCast<int32_t>(trailing_zeros);
	}